

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O1

void __thiscall
Assimp::ASE::Parser::ParseLV3MeshFaceListBlock(Parser *this,uint iNumFaces,Mesh *mesh)

{
  byte bVar1;
  char *pcVar2;
  byte *pbVar3;
  int iVar4;
  uint uVar5;
  vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_> *this_00;
  char *pcVar6;
  Face mFace;
  int local_c4;
  Face local_b8;
  
  this_00 = &(mesh->super_MeshWithSmoothingGroups<Assimp::ASE::Face>).mFaces;
  std::vector<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>::resize
            (this_00,(ulong)iNumFaces);
  local_c4 = 0;
LAB_00413c15:
  do {
    pcVar2 = this->filePtr;
    if (*pcVar2 == '*') {
      this->filePtr = pcVar2 + 1;
      iVar4 = strncmp("MESH_FACE",pcVar2 + 1,9);
      if (iVar4 == 0) {
        bVar1 = pcVar2[10];
        if (((ulong)bVar1 < 0x21) && ((0x100003601U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) {
          pcVar6 = pcVar2 + 0xb;
          if (bVar1 == 0) {
            pcVar6 = pcVar2 + 10;
          }
          this->filePtr = pcVar6;
          local_b8.super_FaceWithSmoothingGroup.mIndices[0] = 0xffffffff;
          local_b8.super_FaceWithSmoothingGroup.mIndices[1] = 0xffffffff;
          local_b8.super_FaceWithSmoothingGroup.mIndices[2] = 0xffffffff;
          local_b8.super_FaceWithSmoothingGroup.iSmoothGroup = 0;
          local_b8.iMaterial = 0xffffffff;
          local_b8.iFace = 0;
          ParseLV4MeshFace(this,&local_b8);
          if (local_b8.iFace < iNumFaces) {
            memcpy((this_00->
                   super__Vector_base<Assimp::ASE::Face,_std::allocator<Assimp::ASE::Face>_>).
                   _M_impl.super__Vector_impl_data._M_start + local_b8.iFace,&local_b8,0x84);
          }
          else {
            LogWarning(this,"Face has an invalid index. It will be ignored");
          }
          goto LAB_00413c15;
        }
      }
    }
    pbVar3 = (byte *)this->filePtr;
    bVar1 = *pbVar3;
    uVar5 = (uint)bVar1;
    if (bVar1 == 0x7b) {
      local_c4 = local_c4 + 1;
    }
    else if (bVar1 == 0x7d) {
      local_c4 = local_c4 + -1;
      if (local_c4 == 0) {
        this->filePtr = (char *)(pbVar3 + 1);
        SkipToNextToken(this);
        return;
      }
    }
    else if (uVar5 == 0) {
      LogError(this,"Encountered unexpected EOL while parsing a *MESH_FACE_LIST chunk (Level 3)");
    }
    if (((uVar5 < 0xe) && ((0x3401U >> (uVar5 & 0x1f) & 1) != 0)) &&
       (this->bLastWasEndLine == false)) {
      this->iLineNumber = this->iLineNumber + 1;
      this->bLastWasEndLine = true;
    }
    else {
      this->bLastWasEndLine = false;
    }
    this->filePtr = (char *)(pbVar3 + 1);
  } while( true );
}

Assistant:

void Parser::ParseLV3MeshFaceListBlock(unsigned int iNumFaces, ASE::Mesh& mesh)
{
    AI_ASE_PARSER_INIT();

    // allocate enough storage in the face array
    mesh.mFaces.resize(iNumFaces);
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;

            // Face entry
            if (TokenMatch(filePtr,"MESH_FACE" ,9))
            {

                ASE::Face mFace;
                ParseLV4MeshFace(mFace);

                if (mFace.iFace >= iNumFaces)
                {
                    LogWarning("Face has an invalid index. It will be ignored");
                }
                else mesh.mFaces[mFace.iFace] = mFace;
                continue;
            }
        }
        AI_ASE_HANDLE_SECTION("3","*MESH_FACE_LIST");
    }
    return;
}